

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,9ul>,int>
               (SmallVector<(anonymous_namespace)::Constructable,_9UL> *v,int *args)

{
  StringRef capturedExpression;
  StringRef macroName;
  ExprLhs<bool> EVar1;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler;
  array<int,_1UL> a;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff2c;
  AssertionHandler *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  AssertionHandler *this;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4c [12];
  Flags in_stack_ffffffffffffff60;
  AssertionHandler local_80;
  undefined4 local_14 [3];
  undefined8 local_8;
  
  local_14[0] = *in_RSI;
  local_8 = in_RDI;
  local_80.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_ffffffffffffff30,
                  CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  this = &local_80;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x6b);
  operator____catch_sr
            ((char *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar2 = 2;
  macroName._4_12_ = in_stack_ffffffffffffff4c;
  macroName.m_start._0_4_ = in_stack_ffffffffffffff48;
  capturedExpression.m_start._7_1_ = in_stack_ffffffffffffff3f;
  capturedExpression.m_start._0_7_ = in_stack_ffffffffffffff38;
  capturedExpression.m_size = (size_type)this;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_ffffffffffffff30,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_ffffffffffffff2c,2),capturedExpression,
             in_stack_ffffffffffffff60);
  std::ranges::__equal_fn::
  operator()<slang::SmallVector<(anonymous_namespace)::Constructable,_9UL>_&,_std::array<int,_1UL>_&,_std::ranges::equal_to,_int_((anonymous_namespace)::Constructable::*)()_const,_std::identity>
            ((__equal_fn *)&std::ranges::equal,local_8,local_14,
             anon_unknown.dwarf_70180c::Constructable::getValue,0);
  EVar1 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_ffffffffffffff2c,uVar2),false);
  Catch::AssertionHandler::handleExpr<bool>
            (this,(ExprLhs<bool> *)CONCAT17(EVar1.m_lhs,in_stack_ffffffffffffff38));
  Catch::AssertionHandler::complete(in_stack_ffffffffffffff30);
  Catch::AssertionHandler::~AssertionHandler(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}